

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void quickSort_recursive<int>(vector<int,_std::allocator<int>_> *vec,int left,int right)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  int __tmp;
  int iVar8;
  
  do {
    if (right <= left) {
      return;
    }
    piVar3 = (vec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    iVar1 = piVar3[left];
    uVar5 = (ulong)(uint)right;
    iVar8 = left;
    do {
      uVar5 = (ulong)(int)uVar5;
      lVar6 = (long)iVar8;
      do {
        iVar4 = piVar3[uVar5];
        if (iVar4 <= iVar1) {
          piVar3[uVar5] = piVar3[lVar6];
          piVar3[lVar6] = iVar4;
          iVar8 = iVar8 + 1;
          break;
        }
        uVar5 = uVar5 - 1;
      } while (lVar6 < (long)uVar5);
      iVar4 = (int)uVar5;
      if (iVar8 < iVar4) {
        piVar7 = piVar3 + iVar8;
        do {
          iVar2 = *piVar7;
          if (iVar1 <= iVar2) {
            *piVar7 = piVar3[iVar4];
            piVar3[iVar4] = iVar2;
            uVar5 = (ulong)(iVar4 - 1);
            break;
          }
          piVar7 = piVar7 + 1;
          iVar8 = iVar8 + 1;
        } while (iVar4 != iVar8);
      }
    } while (iVar8 < (int)uVar5);
    quickSort_recursive<int>(vec,left,iVar8 + -1);
    left = iVar8 + 1;
  } while( true );
}

Assistant:

void quickSort_recursive(vector<T>& vec, int left, int right)
{
    //若数组为空，算法结束
    if (left >= right)
    {
        return;
    }
    int pivot = vec[left];  //设置基准点为首位的值
    int start = left;   //设置左边的哨兵
    int end = right;    //设置右边的哨兵
    //只要左哨兵小于右哨兵，说明没有遍历完，算法继续
    while (start < end)
    {
        //从右往左寻找小于基准点的值。start < end 是为了避免基准点右边的值全部大于基准点，如3, 7, 6, 5。防止end越界访问
        while (start < end && vec[end] > pivot)
        {
            end--;
        }
        //上述循环退出，说明1、start >= end或则2、vecp[end] < pivot
        //此判断为了防止第一种情况，保证是第二种情况
        if (start < end)
        {
            //交换基准点和符合条件的值
            swap(vec[end], vec[start]);
            //此时start处的值已为小于基准点的值，所以直接从下一位开始遍历
            start++;
        }
        //从左往右寻找大于基准点的值
        while (start < end && vec[start] < pivot)
        {
            start++;
        }
        if (start < end)
        {
            swap(vec[start], vec[end]);
            end--;
        }
    }
    //进入递归,已经就位的基准点将数组分为两部分，分别对其进行快速排序。
    //此时start == end,所以end -1 或者 start - 1都可以。下同理
    quickSort_recursive(vec, left, start - 1);
    quickSort_recursive(vec, start + 1, right);
}